

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-val.c
# Opt level: O1

wchar_t borg_lookup_kind(wchar_t tval,wchar_t sval)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  ulong uVar4;
  ulong unaff_R14;
  
  if (1 < (ulong)z_info->k_max) {
    piVar3 = &k_info[1].sval;
    uVar4 = 1;
    do {
      bVar1 = true;
      if ((piVar3[-1] == tval) && (*piVar3 == sval)) {
        bVar1 = false;
        unaff_R14 = uVar4 & 0xffffffff;
      }
      if (!bVar1) {
        return (wchar_t)unaff_R14;
      }
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 0xa8;
    } while (z_info->k_max != uVar4);
  }
  pcVar2 = tval_find_name(tval);
  msg("No object (%s,%d,%d)",pcVar2,tval,sval);
  return L'\0';
}

Assistant:

int borg_lookup_kind(int tval, int sval)
{
    int k;

    /* Look for it */
    for (k = 1; k < z_info->k_max; k++) {
        struct object_kind *k_ptr = &k_info[k];

        /* Found a match */
        if ((k_ptr->tval == tval) && (k_ptr->sval == sval))
            return (k);
    }

    /* Failure */
    msg("No object (%s,%d,%d)", tval_find_name(tval), tval, sval);
    return 0;
}